

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactBvh.cpp
# Opt level: O0

int __thiscall
btBvhTree::_sort_and_calc_splitting_index
          (btBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex,
          int splitAxis)

{
  GIM_BVH_DATA *pGVar1;
  btScalar *pbVar2;
  int in_ECX;
  int in_EDX;
  btAlignedObjectArray<GIM_BVH_DATA> *in_RSI;
  int in_R8D;
  btAlignedObjectArray<GIM_BVH_DATA> *this_00;
  btVector3 bVar3;
  bool unbalanced;
  int rangeBalancedIndices;
  btVector3 center_1;
  btVector3 center;
  btVector3 means;
  btScalar splitValue;
  int numIndices;
  int splitIndex;
  int i;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  btScalar *in_stack_ffffffffffffff50;
  btVector3 *s;
  btVector3 *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  btScalar index1;
  int index0;
  float local_70;
  btScalar local_6c [4];
  undefined4 local_5c;
  btVector3 local_58;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btVector3 local_3c;
  btScalar local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  btAlignedObjectArray<GIM_BVH_DATA> *local_10;
  
  local_28 = in_ECX - in_EDX;
  local_2c = 0.0;
  local_40 = 0.0;
  local_44 = 0.0;
  local_48 = 0.0;
  local_24 = in_EDX;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  btVector3::btVector3(&local_3c,&local_40,&local_44,&local_48);
  for (local_20 = local_14; local_20 < local_18; local_20 = local_20 + 1) {
    local_5c = 0x3f000000;
    pGVar1 = btAlignedObjectArray<GIM_BVH_DATA>::operator[](local_10,local_20);
    in_stack_ffffffffffffff58 = &(pGVar1->m_bound).m_max;
    btAlignedObjectArray<GIM_BVH_DATA>::operator[](local_10,local_20);
    local_6c = (btScalar  [4])
               operator+((btVector3 *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
    local_58 = ::operator*(in_stack_ffffffffffffff50,
                           (btVector3 *)
                           CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    btVector3::operator+=(&local_3c,&local_58);
  }
  local_70 = 1.0 / (float)local_28;
  btVector3::operator*=(&local_3c,&local_70);
  pbVar2 = btVector3::operator_cast_to_float_(&local_3c);
  local_2c = pbVar2[local_1c];
  for (local_20 = local_14; local_20 < local_18; local_20 = local_20 + 1) {
    index0 = 0x3f000000;
    pGVar1 = btAlignedObjectArray<GIM_BVH_DATA>::operator[](local_10,local_20);
    s = &(pGVar1->m_bound).m_max;
    btAlignedObjectArray<GIM_BVH_DATA>::operator[](local_10,local_20);
    bVar3 = operator+((btVector3 *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff58);
    index1 = bVar3.m_floats[3];
    bVar3 = ::operator*(s->m_floats,
                        (btVector3 *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    this_00 = bVar3.m_floats._0_8_;
    pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)&stack0xffffffffffffff80);
    if (local_2c < pbVar2[local_1c]) {
      btAlignedObjectArray<GIM_BVH_DATA>::swap(this_00,index0,(int)index1);
      local_24 = local_24 + 1;
    }
  }
  if (local_24 <= local_14 + local_28 / 3 || (local_18 + -1) - local_28 / 3 <= local_24) {
    local_24 = local_14 + (local_28 >> 1);
  }
  return local_24;
}

Assistant:

int btBvhTree::_sort_and_calc_splitting_index(
	GIM_BVH_DATA_ARRAY & primitive_boxes, int startIndex,
	int endIndex, int splitAxis)
{
	int i;
	int splitIndex =startIndex;
	int numIndices = endIndex - startIndex;

	// average of centers
	btScalar splitValue = 0.0f;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);

	splitValue = means[splitAxis];


	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		if (center[splitAxis] > splitValue)
		{
			//swap
			primitive_boxes.swap(i,splitIndex);
			//swapLeafNodes(i,splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)
	//bool unbalanced2 = true;

	//this should be safe too:
	int rangeBalancedIndices = numIndices/3;
	bool unbalanced = ((splitIndex<=(startIndex+rangeBalancedIndices)) || (splitIndex >=(endIndex-1-rangeBalancedIndices)));

	if (unbalanced)
	{
		splitIndex = startIndex+ (numIndices>>1);
	}

	btAssert(!((splitIndex==startIndex) || (splitIndex == (endIndex))));

	return splitIndex;

}